

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

bool ON_EvaluateQuotientRule(int dim,int der_count,int v_stride,double *v)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  int j;
  ulong uVar11;
  double *pdVar12;
  double dVar13;
  
  lVar3 = (long)dim;
  dVar1 = v[lVar3];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    iVar6 = (der_count + 1) * v_stride;
    if (iVar6 != 0) {
      lVar7 = 0;
      do {
        v[lVar7] = v[lVar7] * (1.0 / dVar1);
        lVar7 = lVar7 + 1;
      } while (iVar6 != (int)lVar7);
    }
    if (der_count != 0) {
      lVar7 = (long)v_stride;
      dVar13 = v[lVar7 + lVar3];
      if (dim != 0) {
        lVar8 = 0;
        do {
          v[lVar7 + lVar8] = v[lVar8] * -dVar13 + v[lVar7 + lVar8];
          lVar8 = lVar8 + 1;
        } while (dim != (int)lVar8);
      }
      if (1 < der_count) {
        if (dim != 0) {
          dVar2 = v[lVar7 * 2 + lVar3];
          pdVar5 = v;
          iVar6 = dim;
          do {
            v = pdVar5 + 1;
            pdVar5[lVar7 * 2] = *pdVar5 * -dVar2 + pdVar5[lVar7] * dVar13 * -2.0 + pdVar5[lVar7 * 2]
            ;
            iVar6 = iVar6 + -1;
            pdVar5 = v;
          } while (iVar6 != 0);
        }
        if (der_count != 2) {
          pdVar5 = v + -lVar3 + v_stride * 2;
          iVar6 = 3;
          if (3 < der_count) {
            iVar6 = der_count;
          }
          uVar10 = 3;
          do {
            pdVar5 = pdVar5 + lVar7;
            pdVar12 = v + uVar10 * lVar7;
            uVar11 = 0;
            pdVar9 = v + -lVar3;
            do {
              j = (int)uVar11;
              dVar13 = ON_BinomialCoefficient((int)uVar10 - j,j);
              if (dim != 0) {
                dVar2 = *pdVar12;
                lVar8 = 0;
                lVar4 = 0;
                do {
                  pdVar5[lVar4] = pdVar9[lVar4] * -dVar13 * dVar2 + pdVar5[lVar4];
                  lVar4 = lVar4 + 1;
                  lVar8 = lVar8 + -8;
                } while (dim != (int)lVar4);
                pdVar5 = (double *)((long)pdVar5 - lVar8);
                pdVar9 = (double *)((long)pdVar9 - lVar8);
              }
              pdVar12 = pdVar12 + -lVar7;
              pdVar5 = pdVar5 + -lVar3;
              pdVar9 = pdVar9 + (v_stride - dim);
              uVar11 = (ulong)(j + 1);
            } while (uVar10 != uVar11);
            uVar10 = uVar10 + 1;
          } while (uVar10 != iVar6 + 1);
        }
      }
    }
  }
  return (bool)(-(dVar1 != 0.0) & 1);
}

Assistant:

bool ON_EvaluateQuotientRule( int dim, int der_count, int v_stride, double *v )
{
  /*
  The quotient rule says the n-th derivative is

            (n)       (n)          (n)             (n-1)    (1)              (1)    (n-1)
          f  (t) =  x   (t)  -  (w  (t)*f(t) + n*w    (t)*f  (t) + ... + n*w  (t)*f    (t))
                    ---------------------------------------------------------------------
                                             w(t)


                                                                        (i)   (j)
         (The missing summands look like  ON_BinomialCoefficient(i,j)*w   * f    )
  */

  double
    wt, w2, *f, *x, *w;
  int
    i, j, n, df;

  wt = v[dim];
  if (wt == 0.0)
    return false;
  wt = 1.0/wt;
  i = (der_count+1)*v_stride;
  x = v;
  while(i--) *x++ *= wt;

  if (der_count) {
    // 1rst derivative - faster special case 
    f = v;            // f = func(t)
    x = v + v_stride; // x = numerator'(t)/w
    wt = -x[dim];     // wt = -denominator'(t)/w
    j = dim; while (j--) *x++ +=  wt* *f++;
    if (der_count> 1) {
      // 2nd derivative - faster special case 
      f = v + v_stride;
      x = f + v_stride;
      // v = func(t), f = func'(t), x = numerator''(t)/w, 
      // * wt = -2*denominator'(t)/w, w2 = denominator''(t)/w
      wt *= 2.0;
      w2 = -x[dim];
      j = dim; while(j--) *x++ += w2* *v++ + wt* *f++;
      if (der_count>2) {
        df = v_stride-dim;
        // higher derivatives use slower loop
        v -= dim;
        x = v + v_stride*2;
        for (n = 3; n <= der_count; n++) {
          // computing n-th derivative
          f = v;
          x += v_stride; // x = numerator^(n)/weight 
          w = v + n*v_stride + dim;
          for (i = 0; i < n; i++) {
            // f = value of i-th derivative 
            // w = ((n-i)-th derivative of denominator)/weight
            wt = -ON_BinomialCoefficient(n-i,i) * *w;
            w -= v_stride;
            j = dim; while (j--) *x++ += *f++ * wt;
            x -= dim;
            f += df;
          }
        }
      }
    }
  }

  return true;
}